

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

CordBuffer __thiscall
absl::lts_20250127::Cord::GetAppendBufferSlowPath
          (Cord *this,size_t block_size,size_t capacity,size_t min_capacity)

{
  undefined1 auVar1 [16];
  Nullable<absl::cord_internal::CordRep_*> this_00;
  CordzInfo *info;
  CordRepBtree *tree;
  CordRepFlat *pCVar2;
  size_t n;
  size_t sVar3;
  char *dst;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  size_t in_R8;
  ExtractResult EVar5;
  CordBuffer CVar6;
  CordzUpdateScope scope;
  
  this_00 = InlineRep::tree((InlineRep *)block_size);
  if (this_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    n = cord_internal::InlineData::Rep::inline_size((Rep *)block_size);
    sVar3 = 0xffffffffffffffff;
    if (!CARRY8(min_capacity,n)) {
      sVar3 = min_capacity + n;
    }
    if (capacity == 0) {
      CordBuffer::CreateWithDefaultLimit((CordBuffer *)this,sVar3);
    }
    else {
      CordBuffer::CreateWithCustomLimitImpl<>((CordBuffer *)this,capacity,sVar3);
    }
    dst = CordBuffer::data((CordBuffer *)this);
    cord_internal::SmallMemmove<false>(dst,(char *)(block_size + 1),n);
    CordBuffer::SetLength((CordBuffer *)this,n);
    *(undefined8 *)block_size = 0;
    *(undefined8 *)(block_size + 8) = 0;
    uVar4 = extraout_RDX_00;
    goto LAB_002539c4;
  }
  info = cord_internal::InlineData::cordz_info((InlineData *)block_size);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kGetAppendBuffer);
  if (this_00->tag == 3) {
    tree = cord_internal::CordRep::btree(this_00);
    EVar5 = cord_internal::CordRepBtree::ExtractAppendBuffer(tree,in_R8);
    if (EVar5.extracted == (CordRep *)0x0) goto LAB_00253969;
LAB_002538f9:
    InlineRep::SetTreeOrEmpty((InlineRep *)block_size,EVar5.tree,&scope);
    pCVar2 = cord_internal::CordRep::flat(EVar5.extracted);
    CordBuffer::CordBuffer((CordBuffer *)this,pCVar2);
  }
  else {
    if ((5 < this_00->tag) && ((this_00->refcount).count_.super___atomic_base<int>._M_i == 2)) {
      pCVar2 = cord_internal::CordRep::flat(this_00);
      sVar3 = cord_internal::CordRepFlat::Capacity(pCVar2);
      if (in_R8 <= sVar3 - this_00->length) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = this_00;
        EVar5 = (ExtractResult)(auVar1 << 0x40);
        goto LAB_002538f9;
      }
    }
LAB_00253969:
    if (capacity == 0) {
      CordBuffer::CreateWithDefaultLimit((CordBuffer *)this,min_capacity);
    }
    else {
      CordBuffer::CreateWithCustomLimitImpl<>((CordBuffer *)this,capacity,min_capacity);
    }
  }
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
  uVar4 = extraout_RDX;
LAB_002539c4:
  CVar6.rep_.field_0.long_rep.padding = (void *)uVar4;
  CVar6.rep_.field_0.long_rep.rep = (CordRepFlat *)this;
  return (CordBuffer)CVar6.rep_.field_0;
}

Assistant:

CordBuffer Cord::GetAppendBufferSlowPath(size_t block_size, size_t capacity,
                                         size_t min_capacity) {
  auto constexpr method = CordzUpdateTracker::kGetAppendBuffer;
  CordRep* tree = contents_.tree();
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    CordRep::ExtractResult result = ExtractAppendBuffer(tree, min_capacity);
    if (result.extracted != nullptr) {
      contents_.SetTreeOrEmpty(result.tree, scope);
      return CordBuffer(result.extracted->flat());
    }
    return block_size ? CordBuffer::CreateWithCustomLimit(block_size, capacity)
                      : CordBuffer::CreateWithDefaultLimit(capacity);
  }
  return CreateAppendBuffer(contents_.data_, block_size, capacity);
}